

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONHandler.cc
# Opt level: O2

void __thiscall JSONHandler::handle(JSONHandler *this,string *path,JSON *j)

{
  JSONHandler *this_00;
  bool bVar1;
  undefined8 extraout_RAX;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  _Head_base<0UL,_JSONHandler::Members_*,_false> this_02;
  bool bvalue;
  string path_base;
  _Any_data local_e8;
  code *local_d8;
  code *pcStack_d0;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  __shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> local_88;
  string s_value;
  __shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_02._M_head_impl =
       (this->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  if (*(_Manager_type *)((long)&(this_02._M_head_impl)->h + 0x10) != (_Manager_type)0x0) {
    std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,(__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)j);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
                  *)this_02._M_head_impl,path,(JSON *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    return;
  }
  s_value._M_dataplus._M_p = (pointer)&s_value.field_2;
  s_value._M_string_length = 0;
  bvalue = false;
  s_value.field_2._M_local_buf[0] = '\0';
  if (*(_Manager_type *)((long)&(this_02._M_head_impl)->h + 0x30) != (_Manager_type)0x0) {
    bVar1 = JSON::isNull(j);
    this_02._M_head_impl =
         (this->m)._M_t.
         super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
         _M_t.
         super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
         super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
    if (bVar1) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)((long)&(this_02._M_head_impl)->h + 0x20),path);
      goto LAB_00123a4c;
    }
  }
  if (*(long *)((long)this_02._M_head_impl + 0x40U + 0x10) == 0) {
LAB_001237e4:
    if (*(long *)((long)this_02._M_head_impl + 0x60U + 0x10) != 0) {
      bVar1 = JSON::getNumber(j,&s_value);
      this_02._M_head_impl =
           (this->m)._M_t.
           super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
           .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
      if (bVar1) {
        this_01 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)((long)&(this_02._M_head_impl)->h + 0x60);
        goto LAB_00123807;
      }
    }
    if (*(long *)((long)this_02._M_head_impl + 0x80U + 0x10) != 0) {
      bVar1 = JSON::getBool(j,&bvalue);
      this_02._M_head_impl =
           (this->m)._M_t.
           super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
           .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
      if (bVar1) {
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                      *)((long)&(this_02._M_head_impl)->h + 0x80),path,bvalue);
        goto LAB_00123a4c;
      }
    }
    if (*(long *)((long)this_02._M_head_impl + 0xa0U + 0x10) != 0) {
      bVar1 = JSON::isDictionary(j);
      this_02._M_head_impl =
           (this->m)._M_t.
           super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
           .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
      if (bVar1) {
        std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_88,(__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)j);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
                      *)((long)&(this_02._M_head_impl)->h + 0xa0),path,(JSON *)&local_88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
        std::__cxx11::string::string((string *)&path_base,(string *)path);
        bVar1 = std::operator!=(&path_base,".");
        if (bVar1) {
          std::__cxx11::string::append((char *)&path_base);
        }
        local_b8 = (code *)0x0;
        pcStack_b0 = (code *)0x0;
        local_c8._M_unused._M_object = (void *)0x0;
        local_c8._8_8_ = 0;
        local_c8._M_unused._M_object = operator_new(0x18);
        *(string **)local_c8._M_unused._0_8_ = path;
        *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
         ((long)local_c8._M_unused._0_8_ + 8) = &path_base;
        *(JSONHandler **)((long)local_c8._M_unused._0_8_ + 0x10) = this;
        pcStack_b0 = std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/JSONHandler.cc:151:27)>
                     ::_M_invoke;
        local_b8 = std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/JSONHandler.cc:151:27)>
                   ::_M_manager;
        JSON::forEachDictItem
                  (j,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
                      *)&local_c8);
        std::_Function_base::~_Function_base((_Function_base *)&local_c8);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)((long)&((this->m)._M_t.
                                 super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
                                 .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl)
                                ->h + 0xc0),path);
        std::__cxx11::string::~string((string *)&path_base);
        goto LAB_00123a4c;
      }
    }
    if (*(long *)((long)this_02._M_head_impl + 0xe0U + 0x10) != 0) {
      bVar1 = JSON::isArray(j);
      this_02._M_head_impl =
           (this->m)._M_t.
           super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
           .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
      if (bVar1) {
        std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_98,(__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)j);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
                      *)((long)&(this_02._M_head_impl)->h + 0xe0),path,(JSON *)&local_98);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
        path_base._M_dataplus._M_p = (pointer)0x0;
        local_e8._M_unused._M_object = (void *)0x0;
        local_e8._8_8_ = 0;
        local_d8 = (code *)0x0;
        pcStack_d0 = (code *)0x0;
        local_e8._M_unused._M_object = operator_new(0x18);
        *(string **)local_e8._M_unused._0_8_ = &path_base;
        *(string **)((long)local_e8._M_unused._0_8_ + 8) = path;
        *(JSONHandler **)((long)local_e8._M_unused._0_8_ + 0x10) = this;
        pcStack_d0 = std::
                     _Function_handler<void_(JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/JSONHandler.cc:170:28)>
                     ::_M_invoke;
        local_d8 = std::
                   _Function_handler<void_(JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/JSONHandler.cc:170:28)>
                   ::_M_manager;
        JSON::forEachArrayItem(j,(function<void_(JSON)> *)&local_e8);
        std::_Function_base::~_Function_base((_Function_base *)&local_e8);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)((long)&((this->m)._M_t.
                                 super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
                                 .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl)
                                ->h + 0x100),path);
        goto LAB_00123a4c;
      }
    }
    this_00 = *(JSONHandler **)((long)this_02._M_head_impl + 0x160U + 0x10);
    if (this_00 == (JSONHandler *)0x0) {
      std::operator+(&local_48,"JSON handler: value at ",path);
      std::operator+(&path_base,&local_48," is not of expected type");
      usage(&path_base);
      std::__cxx11::string::~string((string *)&path_base);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&s_value);
      _Unwind_Resume(extraout_RAX);
    }
    std::__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a8,(__shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2> *)j);
    handle(this_00,path,(JSON *)&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  }
  else {
    bVar1 = JSON::getString(j,&s_value);
    this_02._M_head_impl =
         (this->m)._M_t.
         super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
         _M_t.
         super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
         super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
    if (!bVar1) goto LAB_001237e4;
    this_01 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)((long)&(this_02._M_head_impl)->h + 0x40);
LAB_00123807:
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(this_01,path,&s_value);
  }
LAB_00123a4c:
  std::__cxx11::string::~string((string *)&s_value);
  return;
}

Assistant:

void
JSONHandler::handle(std::string const& path, JSON j)
{
    if (m->h.any_handler) {
        m->h.any_handler(path, j);
        return;
    }

    bool bvalue = false;
    std::string s_value;
    if (m->h.null_handler && j.isNull()) {
        m->h.null_handler(path);
        return;
    }
    if (m->h.string_handler && j.getString(s_value)) {
        m->h.string_handler(path, s_value);
        return;
    }
    if (m->h.number_handler && j.getNumber(s_value)) {
        m->h.number_handler(path, s_value);
        return;
    }
    if (m->h.bool_handler && j.getBool(bvalue)) {
        m->h.bool_handler(path, bvalue);
        return;
    }
    if (m->h.dict_start_handler && j.isDictionary()) {
        m->h.dict_start_handler(path, j);
        std::string path_base = path;
        if (path_base != ".") {
            path_base += ".";
        }
        j.forEachDictItem([&path, &path_base, this](std::string const& k, JSON v) {
            auto i = m->h.dict_handlers.find(k);
            if (i == m->h.dict_handlers.end()) {
                if (m->h.fallback_dict_handler.get()) {
                    m->h.fallback_dict_handler->handle(path_base + k, v);
                } else {
                    QTC::TC("libtests", "JSONHandler unexpected key");
                    usage("JSON handler found unexpected key " + k + " in object at " + path);
                }
            } else {
                i->second->handle(path_base + k, v);
            }
        });
        m->h.dict_end_handler(path);
        return;
    }
    if (m->h.array_start_handler && j.isArray()) {
        m->h.array_start_handler(path, j);
        size_t i = 0;
        j.forEachArrayItem([&i, &path, this](JSON v) {
            m->h.array_item_handler->handle(path + "[" + std::to_string(i) + "]", v);
            ++i;
        });
        m->h.array_end_handler(path);
        return;
    }

    if (m->h.fallback_handler) {
        m->h.fallback_handler->handle(path, j);
        return;
    }

    // It would be nice to include information about what type the object was and what types were
    // allowed, but we're relying on schema validation to make sure input is properly structured
    // before calling the handlers. It would be different if this code were trying to be part of a
    // general-purpose JSON package.
    QTC::TC("libtests", "JSONHandler unhandled value");
    usage("JSON handler: value at " + path + " is not of expected type");
}